

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void __thiscall PSBTInput::PSBTInput(PSBTInput *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  uint256 *puVar3;
  base_blob<256U> *pbVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CTxOut::CTxOut(&this->witness_utxo);
  p_Var1 = &(this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header;
  (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->redeem_script).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->redeem_script).super_CScriptBase._union + 8) = 0;
  *(undefined8 *)((long)&(this->redeem_script).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->redeem_script).super_CScriptBase._union + 0x18) = 0;
  (this->witness_script).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->witness_script).super_CScriptBase._union + 8) = 0;
  *(undefined8 *)((long)&(this->witness_script).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->witness_script).super_CScriptBase._union + 0x18) = 0;
  (this->final_script_sig).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->final_script_sig).super_CScriptBase._union + 8) = 0;
  *(undefined8 *)((long)&(this->final_script_sig).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->final_script_sig).super_CScriptBase._union + 0x18) = 0;
  (this->final_script_witness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->final_script_witness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->final_script_witness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->partial_sigs)._M_t._M_impl.super__Rb_tree_header;
  (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar3 = &(this->m_tap_internal_key).m_keydata;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->m_tap_internal_key).m_keydata.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->m_tap_internal_key).m_keydata.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->m_tap_internal_key).m_keydata.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  puVar3 = &this->m_tap_merkle_root;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->m_tap_merkle_root).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->m_tap_merkle_root).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->m_tap_merkle_root).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PSBTInput() = default;